

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * Extra_TransferLevelByLevel(DdManager *ddSource,DdManager *ddDestination,DdNode *f)

{
  int *Permute;
  DdNode *pDVar1;
  int local_44;
  int local_40;
  int local_3c;
  int i;
  int nMax;
  int nMin;
  int *pPermute;
  DdNode *bRes;
  DdNode *f_local;
  DdManager *ddDestination_local;
  DdManager *ddSource_local;
  
  if (ddDestination->size < ddSource->size) {
    local_40 = ddDestination->size;
  }
  else {
    local_40 = ddSource->size;
  }
  if (ddSource->size < ddDestination->size) {
    local_44 = ddDestination->size;
  }
  else {
    local_44 = ddSource->size;
  }
  Permute = (int *)malloc((long)local_44 << 2);
  for (local_3c = 0; local_3c < local_40; local_3c = local_3c + 1) {
    Permute[ddSource->invperm[local_3c]] = ddDestination->invperm[local_3c];
  }
  if (ddDestination->size < ddSource->size) {
    for (; local_3c < local_44; local_3c = local_3c + 1) {
      Permute[ddSource->invperm[local_3c]] = -1;
    }
  }
  pDVar1 = Extra_TransferPermute(ddSource,ddDestination,f,Permute);
  if (Permute != (int *)0x0) {
    free(Permute);
  }
  return pDVar1;
}

Assistant:

DdNode * Extra_TransferLevelByLevel( DdManager * ddSource, DdManager * ddDestination, DdNode * f )
{
    DdNode * bRes;
    int * pPermute;
    int nMin, nMax, i;

    nMin = ddMin(ddSource->size, ddDestination->size);
    nMax = ddMax(ddSource->size, ddDestination->size);
    pPermute = ABC_ALLOC( int, nMax );
    // set up the variable permutation
    for ( i = 0; i < nMin; i++ )
        pPermute[ ddSource->invperm[i] ] = ddDestination->invperm[i];
    if ( ddSource->size > ddDestination->size )
    {
        for (      ; i < nMax; i++ )
            pPermute[ ddSource->invperm[i] ] = -1;
    }
    bRes = Extra_TransferPermute( ddSource, ddDestination, f, pPermute );
    ABC_FREE( pPermute );
    return bRes;
}